

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadtree.h
# Opt level: O3

void __thiscall
quadtree::
Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
::findIntersectionsInDescendants
          (Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
           *this,Node *node,Node **value,
          vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
          *intersections)

{
  undefined8 uVar1;
  pointer ppVar2;
  pointer ppVar3;
  undefined8 uVar4;
  Node **ppNVar5;
  _Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
  _Var6;
  Node **other;
  Node **__args_1;
  long lVar7;
  float fVar8;
  float fVar9;
  
  ppNVar5 = *(Node ***)&this[1].mBox.width;
  for (__args_1 = *(Node ***)&this[1].mBox; __args_1 != ppNVar5; __args_1 = __args_1 + 1) {
    _Var6.
    super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
    ._M_head_impl =
         (node->children)._M_elems[0]._M_t.
         super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
         ._M_t.
         super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
         .
         super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
    ;
    uVar1 = *(undefined8 *)
             _Var6.
             super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
             ._M_head_impl;
    intersections =
         (vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *)*__args_1
    ;
    ppVar2 = (((_Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                *)&((Node *)intersections)->box)->_M_impl).super__Vector_impl_data._M_start;
    ppVar3 = (((_Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                *)&((Node *)intersections)->box)->_M_impl).super__Vector_impl_data._M_finish;
    fVar9 = SUB84(ppVar2,0);
    fVar8 = (float)uVar1;
    if ((fVar8 < fVar9 + SUB84(ppVar3,0)) &&
       (uVar4 = *(undefined8 *)
                 ((long)_Var6.
                        super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
                        ._M_head_impl + 8), fVar9 < fVar8 + (float)uVar4)) {
      fVar8 = (float)((ulong)ppVar2 >> 0x20);
      fVar9 = (float)((ulong)uVar1 >> 0x20);
      if ((fVar9 < (float)((ulong)ppVar3 >> 0x20) + fVar8) &&
         (fVar8 < fVar9 + (float)((ulong)uVar4 >> 0x20))) {
        std::vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>>::
        emplace_back<Node*const&,Node*const&>
                  ((vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>> *)value,
                   (Node **)node,__args_1);
      }
    }
  }
  lVar7._0_4_ = (this->mBox).left;
  lVar7._4_4_ = (this->mBox).top;
  if (lVar7 != 0) {
    lVar7 = 0;
    do {
      findIntersectionsInDescendants
                (*(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                   **)((long)&(this->mBox).left + lVar7),node,value,intersections);
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x20);
  }
  return;
}

Assistant:

void findIntersectionsInDescendants(Node* node, const T& value, std::vector<std::pair<T, T>>& intersections) const
    {
        // Test against the values stored in this node
        for (const auto& other : node->values)
        {
            if (mGetBox(value).intersects(mGetBox(other)))
                intersections.emplace_back(value, other);
        }
        // Test against values stored into descendants of this node
        if (!isLeaf(node))
        {
            for (const auto& child : node->children)
                findIntersectionsInDescendants(child.get(), value, intersections);
        }
    }